

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLaplacian::unimposeNeumannBC(MLNodeLaplacian *this,int amrlev,Any *a_rhs)

{
  int *piVar1;
  pointer paVar2;
  int i;
  long lVar3;
  FabArray<amrex::FArrayBox> *this_00;
  Box bx;
  MFIter mfi;
  Box BStack_148;
  GpuArray<amrex::LinOpBCType,_3U> local_120;
  GpuArray<amrex::LinOpBCType,_3U> local_110;
  MFItInfo local_104;
  MFIter local_f0;
  Box local_8c;
  Array4<double> local_70;
  
  if ((this->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
    lVar3 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                      super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                      .
                      super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[amrlev].
                      super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    BStack_148.smallend.vect._0_8_ = *(undefined8 *)(lVar3 + 0xac);
    BStack_148.bigend.vect[1] = (int)((ulong)*(undefined8 *)(lVar3 + 0xb8) >> 0x20);
    BStack_148._20_8_ = *(undefined8 *)(lVar3 + 0xc0);
    BStack_148.smallend.vect[2] = (int)*(undefined8 *)(lVar3 + 0xb4);
    BStack_148.bigend.vect[0] = (int)((ulong)*(undefined8 *)(lVar3 + 0xb4) >> 0x20);
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      if ((BStack_148.btype.itype >> ((uint)lVar3 & 0x1f) & 1) == 0) {
        piVar1 = BStack_148.bigend.vect + lVar3;
        *piVar1 = *piVar1 + 1;
      }
    }
    BStack_148.btype.itype = 7;
    paVar2 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_110.arr._0_8_ = *(undefined8 *)paVar2->_M_elems;
    local_110.arr[2] = paVar2->_M_elems[2];
    paVar2 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_120.arr._0_8_ = *(undefined8 *)paVar2->_M_elems;
    local_120.arr[2] = paVar2->_M_elems[2];
    this_00 = &Any::get<amrex::MultiFab>(a_rhs)->super_FabArray<amrex::FArrayBox>;
    local_104.num_streams = Gpu::Device::max_gpu_streams;
    local_104.do_tiling = true;
    local_104.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
    local_104.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
    local_104.tilesize.vect[2] = DAT_007d7ef0;
    local_104.dynamic = true;
    local_104.device_sync = true;
    MFIter::MFIter(&local_f0,&this_00->super_FabArrayBase,&local_104);
    while (local_f0.currentIndex < local_f0.endIndex) {
      MFIter::tilebox(&local_8c,&local_f0);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_70,this_00,&local_f0);
      mlndlap_unimpose_neumann_bc(&local_8c,&local_70,&BStack_148,&local_110,&local_120);
      MFIter::operator++(&local_f0);
    }
    MFIter::~MFIter(&local_f0);
  }
  return;
}

Assistant:

void
MLNodeLaplacian::unimposeNeumannBC (int amrlev, Any& a_rhs) const
{
    if (m_coarsening_strategy == CoarseningStrategy::RAP) {
        const Box& nddom = amrex::surroundingNodes(Geom(amrlev).Domain());
        const auto lobc = LoBC();
        const auto hibc = HiBC();

        AMREX_ASSERT(a_rhs.is<MultiFab>());
        MultiFab& rhs = a_rhs.get<MultiFab>();

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(rhs,mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& rhsarr = rhs.array(mfi);
            mlndlap_unimpose_neumann_bc(bx, rhsarr, nddom, lobc, hibc);
        }
    }
}